

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::SpecifyConditionVisitor::visit<slang::ast::SimpleAssignmentPatternExpression>
          (SpecifyConditionVisitor *this,SimpleAssignmentPatternExpression *expr)

{
  ExpressionKind EVar1;
  bool bVar2;
  ulong uVar3;
  Symbol *pSVar4;
  Diagnostic *this_00;
  
  bVar2 = Expression::bad((Expression *)expr);
  if (bVar2) {
    return;
  }
  uVar3 = (ulong)(expr->super_AssignmentPatternExpressionBase).super_Expression.kind;
  if (uVar3 < 0x26) {
    if ((0x20006d9c00U >> (uVar3 & 0x3f) & 1) == 0) {
      if ((6UL >> (uVar3 & 0x3f) & 1) != 0) {
        return;
      }
      if (uVar3 == 8) {
        pSVar4 = Expression::getSymbolReference((Expression *)expr,true);
        if (pSVar4 == (Symbol *)0x0) {
          return;
        }
        if (pSVar4->kind - Net < 2) {
          if (pSVar4->parentScope == this->specifyParentScope) {
            return;
          }
        }
        else if (pSVar4->kind == Specparam) {
          return;
        }
        this_00 = ASTContext::addDiag(this->context,(DiagCode)0x980007,
                                      (expr->super_AssignmentPatternExpressionBase).super_Expression
                                      .sourceRange);
        Diagnostic::operator<<(this_00,pSVar4->name);
        Diagnostic::addNote(this_00,(DiagCode)0x50001,pSVar4->location);
        return;
      }
    }
    else {
      AssignmentPatternExpressionBase::visitExprs<slang::ast::SpecifyConditionVisitor&>
                (&expr->super_AssignmentPatternExpressionBase,this);
      EVar1 = (expr->super_AssignmentPatternExpressionBase).super_Expression.kind;
      if (EVar1 == Conversion) {
        if (*(int *)&(expr->super_AssignmentPatternExpressionBase).elements_._M_ptr < 2) {
          return;
        }
      }
      else if (EVar1 == BinaryOp) {
        if ((*(uint *)&expr->isLValue < 0x15) &&
           ((0x1807e0U >> (*(uint *)&expr->isLValue & 0x1f) & 1) != 0)) {
          return;
        }
      }
      else if ((EVar1 != UnaryOp) ||
              (*(int *)&(expr->super_AssignmentPatternExpressionBase).elements_._M_ptr - 2U < 8)) {
        return;
      }
    }
  }
  reportError(this,(expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange);
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (expr.bad())
                return;

            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                    if (auto sym = expr.getSymbolReference()) {
                        // Specparams are always allowed.
                        if (sym->kind == SymbolKind::Specparam)
                            break;

                        // Other references must be locally defined nets or variables.
                        if ((sym->kind != SymbolKind::Net && sym->kind != SymbolKind::Variable) ||
                            sym->getParentScope() != specifyParentScope) {
                            auto& diag = context.addDiag(diag::SpecifyPathBadReference,
                                                         expr.sourceRange);
                            diag << sym->name;
                            diag.addNote(diag::NoteDeclarationHere, sym->location);
                        }
                    }
                    break;
                case ExpressionKind::ElementSelect:
                case ExpressionKind::RangeSelect:
                case ExpressionKind::Call:
                case ExpressionKind::MinTypMax:
                case ExpressionKind::Concatenation:
                case ExpressionKind::Replication:
                case ExpressionKind::ConditionalOp:
                case ExpressionKind::UnaryOp:
                case ExpressionKind::BinaryOp:
                case ExpressionKind::Conversion:
                    if constexpr (HasVisitExprs<T, SpecifyConditionVisitor>)
                        expr.visitExprs(*this);

                    if (expr.kind == ExpressionKind::UnaryOp) {
                        switch (expr.template as<UnaryExpression>().op) {
                            case UnaryOperator::BitwiseNot:
                            case UnaryOperator::BitwiseAnd:
                            case UnaryOperator::BitwiseOr:
                            case UnaryOperator::BitwiseXor:
                            case UnaryOperator::BitwiseNand:
                            case UnaryOperator::BitwiseNor:
                            case UnaryOperator::BitwiseXnor:
                            case UnaryOperator::LogicalNot:
                                break;
                            default:
                                reportError(expr.sourceRange);
                        }
                    }
                    else if (expr.kind == ExpressionKind::BinaryOp) {
                        switch (expr.template as<BinaryExpression>().op) {
                            case BinaryOperator::BinaryAnd:
                            case BinaryOperator::BinaryOr:
                            case BinaryOperator::BinaryXor:
                            case BinaryOperator::BinaryXnor:
                            case BinaryOperator::Equality:
                            case BinaryOperator::Inequality:
                            case BinaryOperator::LogicalAnd:
                            case BinaryOperator::LogicalOr:
                                break;
                            default:
                                reportError(expr.sourceRange);
                        }
                    }
                    else if (expr.kind == ExpressionKind::Conversion) {
                        if (!expr.template as<ConversionExpression>().isImplicit())
                            reportError(expr.sourceRange);
                    }
                    break;
                case ExpressionKind::IntegerLiteral:
                case ExpressionKind::RealLiteral:
                    break;
                default:
                    reportError(expr.sourceRange);
                    break;
            }
        }
    }